

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.cpp
# Opt level: O0

void __thiscall
SQInstance::SQInstance(SQInstance *this,SQSharedState *ss,SQClass *c,SQInteger memsize)

{
  SQUnsignedInteger SVar1;
  SQClassMember *o;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 *in_RDI;
  SQUnsignedInteger n;
  SQUnsignedInteger nvalues;
  SQSharedState *in_stack_ffffffffffffff58;
  SQInstance *in_stack_ffffffffffffff60;
  SQObjectPtr *local_48;
  SQUnsignedInteger local_40;
  
  SQDelegable::SQDelegable(&in_stack_ffffffffffffff60->super_SQDelegable);
  *in_RDI = &PTR__SQInstance_00158800;
  local_48 = (SQObjectPtr *)(in_RDI + 0xb);
  do {
    ::SQObjectPtr::SQObjectPtr(local_48);
    local_48 = local_48 + 1;
  } while (local_48 != (SQObjectPtr *)(in_RDI + 0xd));
  in_RDI[10] = in_RCX;
  in_RDI[7] = in_RDX;
  SVar1 = sqvector<SQClassMember>::size((sqvector<SQClassMember> *)(in_RDI[7] + 0x40));
  for (local_40 = 0; local_40 < SVar1; local_40 = local_40 + 1) {
    o = sqvector<SQClassMember>::operator[]((sqvector<SQClassMember> *)(in_RDI[7] + 0x40),local_40);
    ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)(in_RDI + local_40 * 2 + 0xb),&o->val);
  }
  Init(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  return;
}

Assistant:

SQInstance::SQInstance(SQSharedState *ss, SQClass *c, SQInteger memsize)
{
    _memsize = memsize;
    _class = c;
    SQUnsignedInteger nvalues = _class->_defaultvalues.size();
    for(SQUnsignedInteger n = 0; n < nvalues; n++) {
        new (&_values[n]) SQObjectPtr(_class->_defaultvalues[n].val);
    }
    Init(ss);
}